

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemidx(BinaryReader *this,Index *memidx,char *desc)

{
  Result RVar1;
  
  RVar1 = ReadIndex(this,memidx,desc);
  if (RVar1.enum_ != Error) {
    if ((ulong)*memidx <
        (ulong)(((long)(this->memories).
                       super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->memories).
                      super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18)) {
      return (Result)Ok;
    }
    PrintError(this,"memory index %u out of range",(ulong)*memidx);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemidx(Index* memidx, const char* desc) {
  CHECK_RESULT(ReadIndex(memidx, desc));
  ERROR_UNLESS(*memidx < memories.size(), "memory index %u out of range",
               *memidx);
  return Result::Ok;
}